

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_labelf_colored_wrap(nk_context *ctx,nk_color color,char *fmt,...)

{
  char *pcVar1;
  char in_AL;
  undefined8 in_RCX;
  long lVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [256];
  char local_1e8 [8];
  void **local_1e0;
  undefined1 *local_1d8;
  char local_1c8;
  char acStack_1c7 [255];
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_1d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_1e0 = &args[0].overflow_arg_area;
  local_1e8[0] = '\x18';
  local_1e8[1] = '\0';
  local_1e8[2] = '\0';
  local_1e8[3] = '\0';
  local_1e8[4] = '0';
  local_1e8[5] = '\0';
  local_1e8[6] = '\0';
  local_1e8[7] = '\0';
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  nk_strfmt(&local_1c8,(int)fmt,local_1e8,(__va_list_tag *)0x3000000018);
  if (local_1c8 == '\0') {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      pcVar1 = acStack_1c7 + lVar2;
      lVar2 = lVar2 + 1;
    } while (*pcVar1 != '\0');
  }
  nk_text_wrap_colored(ctx,&local_1c8,(int)lVar2,color);
  return;
}

Assistant:

NK_API void
nk_labelf_colored_wrap(struct nk_context *ctx, struct nk_color color,
    const char *fmt, ...)
{
    char buf[256];
    va_list args;
    va_start(args, fmt);
    nk_strfmt(buf, NK_LEN(buf), fmt, args);
    nk_label_colored_wrap(ctx, buf, color);
    va_end(args);
}